

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O2

cio_http_cb_return handle_field_value(cio_http_client *client,char *at,size_t length)

{
  byte bVar1;
  cio_http_location_handler *pcVar2;
  cio_http_cb_t p_Var3;
  cio_http_data_cb_t p_Var4;
  char *__s;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  byte *pbVar8;
  cio_http_data_cb_t p_Var9;
  long lVar10;
  cio_http_cb_return cVar11;
  byte bVar12;
  ulong uVar13;
  byte *__s2;
  size_t sVar14;
  byte *pbVar15;
  bool bVar16;
  
  pcVar2 = client->current_handler;
  bVar12 = *(byte *)&pcVar2[1].on_message_complete;
  cVar11 = (uint)bVar12 & 3;
  switch(cVar11) {
  case CIO_HTTP_CB_SUCCESS:
    goto switchD_001033b5_caseD_0;
  case CIO_HTTP_CB_SKIP_BODY:
    if (length != 0x18) goto LAB_001035de;
    pcVar2[1].on_port = *(cio_http_data_cb_t *)(at + 0x10);
    p_Var4 = *(cio_http_data_cb_t *)(at + 8);
    pcVar2[1].on_schema = *(cio_http_data_cb_t *)at;
    pcVar2[1].on_host = p_Var4;
    pcVar2[1].on_path = (cio_http_data_cb_t)0x3541464145383532;
    pcVar2[1].on_query = (cio_http_data_cb_t)0x37342d343139452d;
    pcVar2[1].on_fragment = (cio_http_data_cb_t)0x2d414335392d4144;
    pcVar2[1].on_header_field_name = (cio_http_data_cb_t)0x3843443042413543;
    *(undefined4 *)&pcVar2[1].on_header_field_value = 0x31314235;
    break;
  case 2:
    if (length == 2) {
      bVar1 = bVar12 | 8;
      if (*(short *)at != 0x3331) {
        bVar1 = bVar12;
      }
      bVar12 = bVar1;
      cVar11 = -(uint)(*(short *)at != 0x3331);
      goto switchD_001033b5_caseD_0;
    }
LAB_001035de:
    cVar11 = CIO_HTTP_CB_ERROR;
    goto switchD_001033b5_caseD_0;
  case 3:
    bVar12 = bVar12 | 4;
    *(byte *)&pcVar2[1].on_message_complete = bVar12;
    p_Var3 = pcVar2[1].on_headers_complete;
    if (p_Var3 != (cio_http_cb_t)0x0) {
      cVar11 = CIO_HTTP_CB_ERROR;
      do {
        for (sVar14 = 0; length != sVar14; sVar14 = sVar14 + 1) {
          if (((byte *)at)[sVar14] == 0x2c) {
            pbVar15 = (byte *)at + sVar14;
            goto LAB_0010346e;
          }
        }
        pbVar15 = (byte *)0x0;
LAB_0010346e:
        sVar14 = (long)pbVar15 - (long)at;
        __s2 = (byte *)at;
        uVar13 = (long)pbVar15 - (long)at;
        if (pbVar15 == (byte *)0x0) {
          sVar14 = length;
          uVar13 = length;
        }
        while( true ) {
          if (sVar14 == 0) goto switchD_001033b5_caseD_0;
          if ((*__s2 != 0x20) && (*__s2 != 9)) break;
          sVar14 = sVar14 - 1;
          __s2 = __s2 + 1;
        }
        sVar6 = sVar14;
        for (lVar10 = 0;
            (((byte *)at)[lVar10 + (uVar13 - 1)] == 9 ||
            (((byte *)at)[lVar10 + (uVar13 - 1)] == 0x20)); lVar10 = lVar10 + -1) {
          sVar6 = sVar6 - 1;
        }
        pbVar8 = __s2;
        while (bVar16 = sVar6 != 0, sVar6 = sVar6 - 1, bVar16) {
          bVar1 = *pbVar8;
          if (((((byte)(bVar1 + 0x81) < 0xa2) || ((bVar1 & 0x7c) == 0x3c)) ||
              ((bVar1 - 0x22 < 0x3c &&
               ((0xe000000430020c1U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) != 0)))) ||
             ((bVar1 == 0x7b || (bVar1 == 0x7d)))) goto switchD_001033b5_caseD_0;
          pbVar8 = pbVar8 + 1;
        }
        p_Var4 = pcVar2[1].on_body;
        for (p_Var9 = (cio_http_data_cb_t)0x0; p_Var9 < p_Var4;
            p_Var9 = (cio_http_data_cb_t)(ulong)((int)p_Var9 + 1)) {
          __s = *(char **)(p_Var3 + (long)p_Var9 * 8);
          sVar7 = strlen(__s);
          if ((sVar14 + lVar10 == sVar7) && (iVar5 = bcmp(__s,__s2,sVar14 + lVar10), iVar5 == 0)) {
            *(int *)((long)&pcVar2[1].on_message_complete + 4) = (int)p_Var9;
            goto LAB_001035c0;
          }
        }
        at = (char *)((byte *)at + uVar13 + 1);
        length = length + ~uVar13;
      } while (pbVar15 != (byte *)0x0);
      goto switchD_001033b5_caseD_0;
    }
  }
LAB_001035c0:
  cVar11 = CIO_HTTP_CB_SUCCESS;
switchD_001033b5_caseD_0:
  *(byte *)&pcVar2[1].on_message_complete = bVar12 & 0xfc;
  return cVar11;
}

Assistant:

static enum cio_http_cb_return handle_field_value(struct cio_http_client *client, const char *at, size_t length)
{
	enum cio_http_cb_return ret = CIO_HTTP_CB_SUCCESS;

	struct cio_websocket_location_handler *wslh = cio_container_of(client->current_handler, struct cio_websocket_location_handler, http_location);

	uint_fast8_t header_field = (uint_fast8_t)wslh->flags.current_header_field;

	switch (header_field) {
	case CIO_WS_HEADER_SEC_WEBSOCKET_KEY:
		ret = save_websocket_key(wslh, at, length);
		break;

	case CIO_WS_HEADER_SEC_WEBSOCKET_VERSION:
		ret = check_websocket_version(wslh, at, length);
		break;

	case CIO_WS_HEADER_SEC_WEBSOCKET_PROTOCOL:
		wslh->flags.subprotocol_requested = 1;
		ret = check_websocket_protocol(wslh, at, length);
		break;

	default:
		break;
	}

	wslh->flags.current_header_field = CIO_WS_HEADER_UNKNOWN;
	return ret;
}